

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O2

string * __thiscall hdc::Driver::getEnvPath(string *__return_storage_ptr__,Driver *this,string *key)

{
  char *pcVar1;
  allocator local_11;
  
  pcVar1 = getenv((key->_M_dataplus)._M_p);
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_11);
  if (pcVar1 != (char *)0x0) {
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Driver::getEnvPath(std::string key) {
    char * val;
    val = std::getenv( key.c_str() );
    std::string retval = "";

    if (val != NULL) {
        retval = val;
    }

    return retval;
}